

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

int __thiscall cfd::core::OutPoint::Compare(OutPoint *this,OutPoint *object)

{
  char *__s1;
  char *__s2;
  string local_60;
  string local_40;
  OutPoint *local_20;
  OutPoint *object_local;
  OutPoint *this_local;
  
  if (this->vout_ < object->vout_) {
    this_local._4_4_ = 1;
  }
  else if (object->vout_ < this->vout_) {
    this_local._4_4_ = -1;
  }
  else {
    local_20 = object;
    object_local = this;
    Txid::GetHex_abi_cxx11_(&local_40,&this->txid_);
    __s1 = (char *)::std::__cxx11::string::c_str();
    Txid::GetHex_abi_cxx11_(&local_60,&local_20->txid_);
    __s2 = (char *)::std::__cxx11::string::c_str();
    this_local._4_4_ = strncmp(__s1,__s2,0x40);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return this_local._4_4_;
}

Assistant:

int OutPoint::Compare(const OutPoint &object) const {
  if (vout_ < object.vout_)
    return 1;
  else if (vout_ > object.vout_)
    return -1;
  return std::strncmp(
      txid_.GetHex().c_str(), object.txid_.GetHex().c_str(),
      kByteData256Length * 2);
}